

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteConstVector(BinaryWriterSpec *this,ConstVector *consts)

{
  v128 *this_00;
  Enum EVar1;
  unsigned_short uVar2;
  int iVar3;
  uint uVar4;
  unsigned_long uVar5;
  ExpectedNan EVar6;
  char *pcVar7;
  ulong uVar8;
  Const *this_01;
  Stream *pSVar9;
  ulong uVar10;
  pointer pCVar11;
  ulong uVar12;
  long local_68;
  Type local_58;
  string local_50;
  
  Stream::Writef(this->json_stream_,"[");
  pCVar11 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar11) {
    local_68 = 0;
    uVar12 = 0;
    do {
      Stream::Writef(this->json_stream_,"{");
      Stream::Writef(this->json_stream_,"\"%s\": ","type");
      EVar1 = pCVar11[uVar12].type_.enum_;
      if (0x10 < (uint)(EVar1 + 0x11)) {
switchD_0014f65c_caseD_fffffff1:
        abort();
      }
      this_01 = pCVar11 + uVar12;
      switch(EVar1) {
      case ExternRef:
        pSVar9 = this->json_stream_;
        pcVar7 = "externref";
        goto LAB_0014f6db;
      case FuncRef:
        pSVar9 = this->json_stream_;
        pcVar7 = "funcref";
LAB_0014f6db:
        Stream::Writef(pSVar9,"\"%s\"",pcVar7);
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        WriteRefBits(this,*(uintptr_t *)(this_01->data_).v);
        break;
      default:
        goto switchD_0014f65c_caseD_fffffff1;
      case V128:
        Stream::Writef(this->json_stream_,"\"%s\"","v128");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","lane_type");
        if ((this_01->type_).enum_ != V128) {
LAB_0014faff:
          __assert_fail("type_ == Type::V128",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                        ,0x6a,"Type wabt::Const::lane_type() const");
        }
        local_58 = this_01->lane_type_;
        Type::GetName_abi_cxx11_(&local_50,&local_58);
        Stream::Writef(this->json_stream_,"\"%s\"",local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"[");
        iVar3 = Const::lane_count(this_01);
        if (0 < iVar3) {
          this_00 = &this_01->data_;
          uVar10 = 0;
          do {
            if ((this_01->type_).enum_ != V128) goto LAB_0014faff;
            iVar3 = (int)uVar10;
            switch((this_01->lane_type_).enum_) {
            case I16:
              pSVar9 = this->json_stream_;
              uVar2 = v128::To<unsigned_short>(this_00,iVar3);
              uVar8 = (ulong)uVar2;
              goto LAB_0014f919;
            case I8:
              if (0xf < uVar10) {
                __assert_fail("(lane + 1) * sizeof(T) <= sizeof(v)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/common.h"
                              ,0x8b,"T v128::To(int) const [T = unsigned char]");
              }
              pSVar9 = this->json_stream_;
              uVar8 = (ulong)(pCVar11->data_).v[uVar10 + local_68];
              goto LAB_0014f919;
            default:
              goto switchD_0014f65c_caseD_fffffff1;
            case F64:
              uVar5 = v128::To<unsigned_long>(this_00,iVar3);
              EVar6 = None;
              if (uVar10 < 4) {
                EVar6 = *(ExpectedNan *)((long)pCVar11->nan_ + uVar10 * 4 + local_68);
              }
              WriteF64(this,uVar5,EVar6);
              break;
            case F32:
              uVar4 = v128::To<unsigned_int>(this_00,iVar3);
              EVar6 = None;
              if (uVar10 < 4) {
                EVar6 = *(ExpectedNan *)((long)pCVar11->nan_ + uVar10 * 4 + local_68);
              }
              WriteF32(this,uVar4,EVar6);
              break;
            case I64:
              pSVar9 = this->json_stream_;
              uVar5 = v128::To<unsigned_long>(this_00,iVar3);
              Stream::Writef(pSVar9,"\"%lu\"",uVar5);
              break;
            case I32:
              pSVar9 = this->json_stream_;
              uVar4 = v128::To<unsigned_int>(this_00,iVar3);
              uVar8 = (ulong)uVar4;
LAB_0014f919:
              Stream::Writef(pSVar9,"\"%u\"",uVar8);
            }
            iVar3 = Const::lane_count(this_01);
            if (uVar10 != iVar3 - 1) {
              Stream::Writef(this->json_stream_,", ");
            }
            uVar10 = uVar10 + 1;
            iVar3 = Const::lane_count(this_01);
          } while ((long)uVar10 < (long)iVar3);
        }
        Stream::Writef(this->json_stream_,"]");
        break;
      case F64:
        Stream::Writef(this->json_stream_,"\"%s\"","f64");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        WriteF64(this,*(uint64_t *)(this_01->data_).v,this_01->nan_[0]);
        break;
      case F32:
        Stream::Writef(this->json_stream_,"\"%s\"","f32");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        WriteF32(this,*(uint32_t *)(this_01->data_).v,this_01->nan_[0]);
        break;
      case I64:
        Stream::Writef(this->json_stream_,"\"%s\"","i64");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"\"%lu\"",*(undefined8 *)(this_01->data_).v);
        break;
      case I32:
        Stream::Writef(this->json_stream_,"\"%s\"","i32");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"\"%u\"",(ulong)*(uint *)(this_01->data_).v);
      }
      Stream::Writef(this->json_stream_,"}");
      if (uVar12 != ((long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333 - 1U
         ) {
        Stream::Writef(this->json_stream_,", ");
      }
      uVar12 = uVar12 + 1;
      pCVar11 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_68 = local_68 + 0x50;
    } while (uVar12 < (ulong)(((long)(consts->
                                     super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pCVar11 >> 4)
                             * -0x3333333333333333));
  }
  Stream::Writef(this->json_stream_,"]");
  return;
}

Assistant:

void BinaryWriterSpec::WriteConstVector(const ConstVector& consts) {
  json_stream_->Writef("[");
  for (size_t i = 0; i < consts.size(); ++i) {
    const Const& const_ = consts[i];
    WriteConst(const_);
    if (i != consts.size() - 1) {
      WriteSeparator();
    }
  }
  json_stream_->Writef("]");
}